

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  anon_enum_32 delim;
  long lVar5;
  cmListFileBacktrace lfbt;
  string local_2a8;
  cmListFileContext lfc;
  ostringstream error;
  cmListFileContext local_a0;
  
  std::__cxx11::string::assign((char *)&this->FunctionName);
  this->FunctionLine = line;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Unexpected end of file.\n");
      std::operator<<(poVar3,"Parse error.  Function missing opening \"(\".");
      std::__cxx11::stringbuf::str();
      IssueError(this,&lfc.Name);
      goto LAB_00229afe;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type != cmListFileLexer_Token_ParenLeft) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Expected \"(\", got ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," with text \"");
    poVar3 = std::operator<<(poVar3,pcVar2->text);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    IssueError(this,&lfc.Name);
LAB_00229afe:
    std::__cxx11::string::~string((string *)&lfc);
LAB_00229b08:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    return false;
  }
  delim = SeparationOkay;
  lVar5 = 0;
LAB_002297ac:
  this->Separation = delim;
LAB_002297af:
  pcVar2 = cmListFileLexer_Scan(this->Lexer);
  if (pcVar2 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    lfc.DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    std::__cxx11::string::assign((char *)&lfc.FilePath);
    lfc.Line = line;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&lfbt,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)&this->Backtrace);
    cmListFileContext::cmListFileContext(&local_a0,&lfc);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_2a8,
               (cmListFileContext *)&lfbt);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&lfbt,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&local_2a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a8._M_string_length);
    cmListFileContext::~cmListFileContext(&local_a0);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
    std::operator<<(poVar3,"End of file reached.");
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_2a8,&lfbt);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmListFileContext::~cmListFileContext(&lfc);
    goto LAB_00229b08;
  }
  switch(pcVar2->type) {
  case cmListFileLexer_Token_Space:
  case cmListFileLexer_Token_Newline:
    this->Separation = SeparationOkay;
    goto LAB_002297af;
  case cmListFileLexer_Token_Identifier:
  case cmListFileLexer_Token_ArgumentUnquoted:
    goto switchD_002297d8_caseD_3;
  case cmListFileLexer_Token_ParenLeft:
    goto switchD_002297d8_caseD_4;
  case cmListFileLexer_Token_ParenRight:
    if (lVar5 == 0) {
      this->FunctionLineEnd = (long)pcVar2->line;
      return true;
    }
    this->Separation = SeparationOkay;
    bVar1 = AddArgument(this,pcVar2,Unquoted);
    if (!bVar1) {
      return false;
    }
    lVar5 = lVar5 + -1;
    delim = SeparationWarning;
    goto LAB_002297ac;
  case cmListFileLexer_Token_ArgumentQuoted:
    delim = SeparationWarning;
    break;
  case cmListFileLexer_Token_ArgumentBracket:
    delim = SeparationError;
    break;
  case cmListFileLexer_Token_CommentBracket:
    delim = SeparationError;
    goto LAB_002297ac;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
    poVar3 = std::operator<<(poVar3,"Instead found ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," with text \"");
    poVar3 = std::operator<<(poVar3,pcVar2->text);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    IssueError(this,&lfc.Name);
    goto LAB_00229afe;
  }
  bVar1 = AddArgument(this,pcVar2,delim);
  goto LAB_00229873;
switchD_002297d8_caseD_4:
  lVar5 = lVar5 + 1;
  this->Separation = SeparationOkay;
  bVar1 = AddArgument(this,pcVar2,Unquoted);
  if (!bVar1) {
    return false;
  }
  goto LAB_002297af;
switchD_002297d8_caseD_3:
  bVar1 = AddArgument(this,pcVar2,Unquoted);
  delim = SeparationWarning;
LAB_00229873:
  if (bVar1 == false) {
    return false;
  }
  goto LAB_002297ac;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->FunctionName = name;
  this->FunctionLine = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->FunctionLineEnd = token->line;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}